

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void cleanup_vault(void)

{
  vault *pvVar1;
  vault *next;
  vault *v;
  
  next = vaults;
  while (next != (vault *)0x0) {
    pvVar1 = next->next;
    mem_free(next->name);
    mem_free(next->typ);
    mem_free(next->text);
    mem_free(next);
    next = pvVar1;
  }
  return;
}

Assistant:

static void cleanup_vault(void)
{
	struct vault *v, *next;
	for (v = vaults; v; v = next) {
		next = v->next;
		mem_free(v->name);
		mem_free(v->typ);
		mem_free(v->text);
		mem_free(v);
	}
}